

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeomObj.cpp
# Opt level: O3

void __thiscall GeometricObject::find_texture(GeometricObject *this,Vector *p,SurfaceData *t)

{
  Map *pMVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  Texture *pTVar7;
  double local_38;
  double dStack_30;
  double local_28;
  
  t->kt = (this->def_material).kt;
  dVar5 = (this->def_material).ka;
  dVar6 = (this->def_material).kd;
  uVar2 = *(undefined4 *)((long)&(this->def_material).ks + 4);
  uVar3 = *(undefined4 *)&(this->def_material).kr;
  uVar4 = *(undefined4 *)((long)&(this->def_material).kr + 4);
  *(undefined4 *)&t->ks = *(undefined4 *)&(this->def_material).ks;
  *(undefined4 *)((long)&t->ks + 4) = uVar2;
  *(undefined4 *)&t->kr = uVar3;
  *(undefined4 *)((long)&t->kr + 4) = uVar4;
  t->ka = dVar5;
  t->kd = dVar6;
  dVar5 = (this->def_material).color.y;
  (t->color).x = (this->def_material).color.x;
  (t->color).y = dVar5;
  (t->color).z = (this->def_material).color.z;
  dVar5 = (this->def_material).med.beta;
  (t->med).ior = (this->def_material).med.ior;
  (t->med).beta = dVar5;
  t->p = (this->def_material).p;
  dVar5 = (this->def_material).n.y;
  (t->n).x = (this->def_material).n.x;
  (t->n).y = dVar5;
  (t->n).z = (this->def_material).n.z;
  dVar5 = (this->def_material).map_coord.y;
  (t->map_coord).x = (this->def_material).map_coord.x;
  (t->map_coord).y = dVar5;
  (t->map_coord).z = (this->def_material).map_coord.z;
  (*this->_vptr_GeometricObject[3])(&local_38,this,p);
  (t->n).x = local_38;
  (t->n).y = dStack_30;
  (t->n).z = local_28;
  pMVar1 = this->mapping;
  if (pMVar1 != (Map *)0x0) {
    (**(code **)(*(long *)pMVar1 + 0x10))(&local_38,pMVar1,p);
    (t->map_coord).x = local_38;
    (t->map_coord).y = dStack_30;
    (t->map_coord).z = local_28;
  }
  for (pTVar7 = this->material; pTVar7 != (Texture *)0x0; pTVar7 = pTVar7->next) {
    (*pTVar7->_vptr_Texture[2])(pTVar7,p,t);
  }
  return;
}

Assistant:

void GeometricObject::find_texture(Vector& p, SurfaceData& t)
{
    Texture *m;

    t = def_material;
    t.n = find_normal(p);

    if(mapping) t.map_coord = mapping->apply(p);

    for( m = material; m != 0; m = m->next) m->apply(p,t);
}